

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureVectorizer.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::FeatureVectorizer_InputColumn::SerializeWithCachedSizes
          (FeatureVectorizer_InputColumn *this,CodedOutputStream *output)

{
  string *psVar1;
  size_type sVar2;
  
  psVar1 = (this->inputcolumn_).ptr_;
  sVar2 = psVar1->_M_string_length;
  if (sVar2 != 0) {
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((psVar1->_M_dataplus)._M_p,(int)sVar2,SERIALIZE,
               "CoreML.Specification.FeatureVectorizer.InputColumn.inputColumn");
    google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased
              (1,(this->inputcolumn_).ptr_,output);
  }
  if (this->inputdimensions_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteUInt64(2,this->inputdimensions_,output);
    return;
  }
  return;
}

Assistant:

void FeatureVectorizer_InputColumn::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.FeatureVectorizer.InputColumn)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // string inputColumn = 1;
  if (this->inputcolumn().size() > 0) {
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
      this->inputcolumn().data(), this->inputcolumn().length(),
      ::google::protobuf::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.FeatureVectorizer.InputColumn.inputColumn");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      1, this->inputcolumn(), output);
  }

  // uint64 inputDimensions = 2;
  if (this->inputdimensions() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64(2, this->inputdimensions(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.FeatureVectorizer.InputColumn)
}